

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall dynamicgraph::TracerRealTime::trace(TracerRealTime *this)

{
  bool bVar1;
  reference ppbVar2;
  ExceptionTraces *pEVar3;
  reference ppbVar4;
  ulong uVar5;
  OutStringStream *local_108;
  allocator<char> local_d9;
  string local_d8 [36];
  ErrorCodeEnum local_b4;
  basic_ofstream<char,_std::char_traits<char>_> *local_b0;
  ofstream *hardFile;
  string local_a0 [36];
  ErrorCodeEnum local_7c;
  OutStringStream *local_78;
  OutStringStream *file;
  allocator<char> local_59;
  string local_58 [36];
  ErrorCodeEnum local_34;
  basic_ostream<char,_std::char_traits<char>_> *local_30;
  ostream *os;
  _List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*> local_20;
  iterator hardIter;
  iterator iter;
  TracerRealTime *this_local;
  
  hardIter._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)&this->field_0x190);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
       ::begin(&this->hardFiles);
  while( true ) {
    os = (ostream *)
         std::__cxx11::
         list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::end((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)&this->field_0x190);
    bVar1 = std::operator!=((_Self *)&os,(_Self *)&hardIter);
    if (!bVar1) {
      return;
    }
    ppbVar2 = std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator*
                        ((_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)
                         &hardIter);
    local_30 = *ppbVar2;
    if (local_30 == (basic_ostream<char,_std::char_traits<char>_> *)0x0) break;
    if (local_30 == (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
      local_108 = (OutStringStream *)0x0;
    }
    else {
      local_108 = (OutStringStream *)
                  __dynamic_cast(local_30,&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
    }
    local_78 = local_108;
    if (local_108 == (OutStringStream *)0x0) {
      hardFile._6_1_ = 1;
      pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
      local_7c = NOT_OPEN;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"The buffer is not open",(allocator<char> *)((long)&hardFile + 7));
      dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_7c,local_a0,"");
      hardFile._6_1_ = 0;
      __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionTraces::~ExceptionTraces);
    }
    ppbVar4 = std::_List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*>::operator*
                        (&local_20);
    local_b0 = *ppbVar4;
    uVar5 = std::ios::good();
    if ((uVar5 & 1) == 0) {
      pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
      local_b4 = NOT_OPEN;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"The file is not open",&local_d9);
      dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_b4,local_d8,"");
      __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionTraces::~ExceptionTraces);
    }
    uVar5 = std::ios::good();
    if (((uVar5 & 1) != 0) && (local_78 != (OutStringStream *)0x0)) {
      OutStringStream::dump(local_78,(ostream *)local_b0);
      OutStringStream::empty(local_78);
      std::ostream::flush();
    }
    std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator++
              ((_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)&hardIter);
    std::_List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*>::operator++(&local_20)
    ;
  }
  file._3_1_ = 1;
  pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
  local_34 = NOT_OPEN;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"The buffer is null",&local_59);
  dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_34,local_58,"");
  file._3_1_ = 0;
  __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionTraces::~ExceptionTraces);
}

Assistant:

void TracerRealTime::trace() {
  dgDEBUGIN(15);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(35) << "Next" << endl;
    std::ostream *os = *iter;
    if (NULL == os) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN, "The buffer is null",
                               "");
    }
    // std::stringstream & file = * dynamic_cast< stringstream* >(os);
    OutStringStream *file = dynamic_cast<OutStringStream *>(os);  // segfault
    if (NULL == file) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The buffer is not open", "");
    }

    std::ofstream &hardFile = **hardIter;
    if (!hardFile.good()) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The file is not open", "");
    }

    if ((hardFile.good()) && (NULL != file)) {
      file->dump(hardFile);
      file->empty();
      hardFile.flush();
    }

    ++iter;
    ++hardIter;
  }

  dgDEBUGOUT(15);
}